

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_basic.c
# Opt level: O3

_Bool test_copy(void)

{
  uint n_row;
  uint n_col;
  long lVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint8_t *puVar7;
  size_t sVar8;
  ulong uVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  size_t sVar12;
  ulong uVar13;
  uint uVar14;
  _Bool _Var15;
  uint8_t auStack_a0 [8];
  uint8_t auStack_98 [8];
  undefined1 local_90 [8];
  m256v A;
  m256v B;
  
  uVar6 = 0;
  _Var15 = false;
  do {
    n_row = (&DAT_00104690)[uVar6];
    uVar4 = 1;
    if (1 < (int)n_row) {
      uVar4 = (ulong)n_row;
    }
    lVar5 = 0;
    do {
      n_col = (&DAT_001046b0)[lVar5];
      uVar14 = n_col * n_row;
      uVar9 = (ulong)uVar14 + 0xf & 0xfffffffffffffff0;
      lVar1 = -uVar9;
      puVar7 = auStack_98 + lVar1;
      if (0 < (int)uVar14) {
        uVar13 = 0;
        do {
          puVar10 = auStack_a0 + lVar1;
          builtin_memcpy(auStack_a0 + lVar1,"\x17\x1d\x10",4);
          puVar10[4] = '\0';
          puVar10[5] = '\0';
          puVar10[6] = '\0';
          puVar10[7] = '\0';
          iVar3 = rand();
          puVar7[uVar13] = (uint8_t)iVar3;
          uVar13 = uVar13 + 1;
        } while (uVar14 != uVar13);
      }
      puVar11 = auStack_a0 + lVar1;
      builtin_memcpy(auStack_a0 + lVar1,">\x1d\x10",4);
      puVar11[4] = '\0';
      puVar11[5] = '\0';
      puVar11[6] = '\0';
      puVar11[7] = '\0';
      m256v_make((m256v *)local_90,n_row,n_col,puVar7);
      lVar2 = -uVar9;
      puVar7 = puVar7 + lVar2;
      builtin_memcpy(auStack_98 + lVar2 + lVar1 + -8,"Y\x1d\x10",4);
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      m256v_make((m256v *)&A.e,n_row,n_col,puVar7);
      builtin_memcpy(auStack_98 + lVar2 + lVar1 + -8,"d\x1d\x10",4);
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      m256v_copy((m256v *)local_90,(m256v *)&A.e);
      if ((int)n_col < 2) {
        n_col = 1;
      }
      uVar9 = 0;
      sVar8 = A.rstride;
      sVar12 = B.rstride;
      do {
        uVar13 = 0;
        do {
          if (*(char *)(sVar8 + uVar13) != *(char *)(sVar12 + uVar13)) {
            return _Var15;
          }
          uVar13 = uVar13 + 1;
        } while (n_col != uVar13);
        uVar9 = uVar9 + 1;
        sVar12 = sVar12 + B._0_8_;
        sVar8 = sVar8 + A._0_8_;
      } while (uVar9 != uVar4);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    _Var15 = 4 < uVar6;
    uVar6 = uVar6 + 1;
  } while (uVar6 != 6);
  return true;
}

Assistant:

static bool test_copy()
{
	const int nrow[] = { 1, 2, 3, 5, 9, 10 };
	const int ncol[] = { 1, 2, 3, 7, 8, 10 };
	for (int ir = 0; ir < array_size(nrow); ++ir) {
		const int nr = nrow[ir];
		for (int ic = 0; ic < array_size(ncol); ++ic) {
			const int nc = ncol[ic];

			Def_mat256_rand(A, a, nr, nc, 0xff)
			m256v_Def(B, b, nr, nc);
			m256v_copy(&A, &B);

			for (int r = 0; r < nr; ++r) {
				for (int c = 0; c < nc; ++c) {
					if (m256v_get_el(&A, r, c)
					   != m256v_get_el(&B, r, c))
					{
						return false;
					}
				}
			}
		}
	}

	return true;
}